

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

PaError Pa_OpenDefaultStream
                  (PaStream **stream,int inputChannelCount,int outputChannelCount,
                  PaSampleFormat sampleFormat,double sampleRate,unsigned_long framesPerBuffer,
                  PaStreamCallback *streamCallback,void *userData)

{
  uint uVar1;
  PaError PVar2;
  PaStreamParameters *outputParameters;
  PaStreamParameters *inputParameters;
  int hostSpecificDeviceIndex_1;
  PaStreamParameters hostApiOutputParameters;
  PaStreamParameters hostApiInputParameters;
  int local_74;
  PaStreamParameters local_70;
  PaStreamParameters local_50;
  
  if (inputChannelCount < 1) {
    inputParameters = (PaStreamParameters *)0x0;
LAB_0010583c:
    if (outputChannelCount < 1) {
      outputParameters = (PaStreamParameters *)0x0;
    }
    else {
      if (initializationCount_ == 0) {
        uVar1 = 0xffffd8f0;
      }
      else {
        uVar1 = 0xffffd8fe;
        if (defaultHostApiIndex_ < hostApisCount_) {
          uVar1 = defaultHostApiIndex_;
        }
        if (defaultHostApiIndex_ < 0) {
          uVar1 = 0xffffd8fe;
        }
      }
      if ((int)uVar1 < 0) {
        local_70.device = -1;
      }
      else {
        local_70.device = (hostApis_[uVar1]->info).defaultOutputDevice;
      }
      if (local_70.device == -1) goto LAB_0010590d;
      outputParameters = &local_70;
      local_70.channelCount = outputChannelCount;
      local_70.sampleFormat = sampleFormat;
      uVar1 = FindHostApi(local_70.device,&local_74);
      local_70.suggestedLatency = hostApis_[uVar1]->deviceInfos[local_74]->defaultHighOutputLatency;
      local_70.hostApiSpecificStreamInfo = (void *)0x0;
    }
    PVar2 = Pa_OpenStream(stream,inputParameters,outputParameters,sampleRate,framesPerBuffer,0,
                          streamCallback,userData);
  }
  else {
    if (initializationCount_ == 0) {
      uVar1 = 0xffffd8f0;
    }
    else {
      uVar1 = 0xffffd8fe;
      if (defaultHostApiIndex_ < hostApisCount_) {
        uVar1 = defaultHostApiIndex_;
      }
      if (defaultHostApiIndex_ < 0) {
        uVar1 = 0xffffd8fe;
      }
    }
    if ((int)uVar1 < 0) {
      local_50.device = -1;
    }
    else {
      local_50.device = (hostApis_[uVar1]->info).defaultInputDevice;
    }
    if (local_50.device != -1) {
      inputParameters = &local_50;
      local_50.channelCount = inputChannelCount;
      local_50.sampleFormat = sampleFormat;
      uVar1 = FindHostApi(local_50.device,&local_70.device);
      local_50.suggestedLatency =
           hostApis_[uVar1]->deviceInfos[local_70.device]->defaultHighInputLatency;
      local_50.hostApiSpecificStreamInfo = (void *)0x0;
      goto LAB_0010583c;
    }
LAB_0010590d:
    PVar2 = -0x2701;
  }
  return PVar2;
}

Assistant:

PaError Pa_OpenDefaultStream( PaStream** stream,
                              int inputChannelCount,
                              int outputChannelCount,
                              PaSampleFormat sampleFormat,
                              double sampleRate,
                              unsigned long framesPerBuffer,
                              PaStreamCallback *streamCallback,
                              void *userData )
{
    PaError result;
    PaStreamParameters hostApiInputParameters, hostApiOutputParameters;
    PaStreamParameters *hostApiInputParametersPtr, *hostApiOutputParametersPtr;

    PA_LOGAPI_ENTER_PARAMS( "Pa_OpenDefaultStream" );
    PA_LOGAPI(("\tPaStream** stream: 0x%p\n", stream ));
    PA_LOGAPI(("\tint inputChannelCount: %d\n", inputChannelCount ));
    PA_LOGAPI(("\tint outputChannelCount: %d\n", outputChannelCount ));
    PA_LOGAPI(("\tPaSampleFormat sampleFormat: %d\n", sampleFormat ));
    PA_LOGAPI(("\tdouble sampleRate: %g\n", sampleRate ));
    PA_LOGAPI(("\tunsigned long framesPerBuffer: %d\n", framesPerBuffer ));
    PA_LOGAPI(("\tPaStreamCallback *streamCallback: 0x%p\n", streamCallback ));
    PA_LOGAPI(("\tvoid *userData: 0x%p\n", userData ));


    if( inputChannelCount > 0 )
    {
        hostApiInputParameters.device = Pa_GetDefaultInputDevice();
		if( hostApiInputParameters.device == paNoDevice )
			return paDeviceUnavailable; 
	
        hostApiInputParameters.channelCount = inputChannelCount;
        hostApiInputParameters.sampleFormat = sampleFormat;
        /* defaultHighInputLatency is used below instead of
           defaultLowInputLatency because it is more important for the default
           stream to work reliably than it is for it to work with the lowest
           latency.
         */
        hostApiInputParameters.suggestedLatency = 
             Pa_GetDeviceInfo( hostApiInputParameters.device )->defaultHighInputLatency;
        hostApiInputParameters.hostApiSpecificStreamInfo = NULL;
        hostApiInputParametersPtr = &hostApiInputParameters;
    }
    else
    {
        hostApiInputParametersPtr = NULL;
    }

    if( outputChannelCount > 0 )
    {
        hostApiOutputParameters.device = Pa_GetDefaultOutputDevice();
		if( hostApiOutputParameters.device == paNoDevice )
			return paDeviceUnavailable; 

        hostApiOutputParameters.channelCount = outputChannelCount;
        hostApiOutputParameters.sampleFormat = sampleFormat;
        /* defaultHighOutputLatency is used below instead of
           defaultLowOutputLatency because it is more important for the default
           stream to work reliably than it is for it to work with the lowest
           latency.
         */
        hostApiOutputParameters.suggestedLatency =
             Pa_GetDeviceInfo( hostApiOutputParameters.device )->defaultHighOutputLatency;
        hostApiOutputParameters.hostApiSpecificStreamInfo = NULL;
        hostApiOutputParametersPtr = &hostApiOutputParameters;
    }
    else
    {
        hostApiOutputParametersPtr = NULL;
    }


    result = Pa_OpenStream(
                 stream, hostApiInputParametersPtr, hostApiOutputParametersPtr,
                 sampleRate, framesPerBuffer, paNoFlag, streamCallback, userData );

    PA_LOGAPI(("Pa_OpenDefaultStream returned:\n" ));
    PA_LOGAPI(("\t*(PaStream** stream): 0x%p", *stream ));
    PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));

    return result;
}